

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExprWriter.cpp
# Opt level: O1

void __thiscall ExprWriter::visit(ExprWriter *this,CallExpr *expr)

{
  pointer ppEVar1;
  bool bVar2;
  int iVar3;
  Expr *pEVar4;
  pointer ppEVar5;
  Expr *call;
  Expr *pEVar6;
  bool bVar7;
  
  iVar3 = std::__cxx11::string::compare((char *)&expr->funcName);
  if (iVar3 == 0) {
    bVar7 = true;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&expr->funcName);
    bVar7 = iVar3 == 0;
  }
  pEVar6 = expr->funcValue;
  if (pEVar6 == (Expr *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (this->ss,(expr->funcName)._M_dataplus._M_p,(expr->funcName)._M_string_length);
  }
  else {
    if (this->noFuncCasts == true) {
      while( true ) {
        if (pEVar6 == (Expr *)0x0) {
          pEVar4 = (Expr *)0x0;
        }
        else {
          bVar2 = CastExpr::classof(pEVar6);
          pEVar4 = (Expr *)0x0;
          if (bVar2) {
            pEVar4 = pEVar6;
          }
        }
        if (pEVar4 == (Expr *)0x0) break;
        pEVar6 = *(Expr **)&pEVar4[1].kind;
      }
    }
    parensIfNotSimple(this,pEVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,"(",1);
  if (bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>(this->ss,"(void*)(",8);
  }
  ppEVar5 = (expr->params).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar1 = (expr->params).super__Vector_base<Expr_*,_std::allocator<Expr_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppEVar5 != ppEVar1) {
    bVar2 = true;
    do {
      pEVar6 = *ppEVar5;
      if (bVar2) {
        (*pEVar6->_vptr_Expr[2])(pEVar6,this);
        if (bVar7) {
          std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(this->ss,", ",2);
        (*pEVar6->_vptr_Expr[2])(pEVar6,this);
      }
      ppEVar5 = ppEVar5 + 1;
      bVar2 = false;
    } while (ppEVar5 != ppEVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->ss,")",1);
  return;
}

Assistant:

void ExprWriter::visit(CallExpr& expr) {
    bool isVaFunc = (expr.funcName == "va_start" || expr.funcName == "va_end");

    if (expr.funcValue) {
        auto call = expr.funcValue;

        if (noFuncCasts) {
            // strip all the casts
            while (auto CAST = llvm::dyn_cast_or_null<CastExpr>(call)) {
                call = CAST->expr;
            }
        }

        parensIfNotSimple(call);
    } else {
        ss << expr.funcName;
    }

    ss << "(";
    if (isVaFunc) {
        ss << "(void*)(";
    }

    bool first = true;
    for (auto param : expr.params) {
        if (first) {
            param->accept(*this);
            if (isVaFunc) {
                ss << ")";
            }

        } else {
            ss << ", ";
            param->accept(*this);
        }

        first = false;
    }

    ss << ")";
}